

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O1

vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
* duckdb::CreateCastExpressions
            (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             *__return_storage_ptr__,WriteCSVData *bind_data,ClientContext *context,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            *names,vector<duckdb::LogicalType,_true> *sql_types)

{
  LogicalTypeId LVar1;
  undefined8 uVar2;
  mapped_type *pmVar3;
  Binder *pBVar4;
  Binder *this;
  idx_t index;
  const_reference args_1;
  const_reference args;
  BoundExpression *pBVar5;
  ConstantExpression *pCVar6;
  type binder_00;
  undefined8 result_type;
  map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *expressions;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> func;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  unbound_expressions;
  shared_ptr<duckdb::Binder,_true> binder;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_120;
  ConstantExpression *local_118;
  char local_109;
  undefined1 local_108 [8];
  element_type *peStack_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  optional_ptr<duckdb::DummyBinding,_true> local_e8;
  undefined1 local_e0 [104];
  Val local_78;
  undefined8 local_68;
  map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
  *local_60;
  undefined1 local_58 [32];
  ClientContext *local_38;
  
  this_00 = &(bind_data->super_BaseCSVData).options.write_date_format;
  local_e0[0] = (string)0xf;
  local_e8.ptr = (DummyBinding *)__return_storage_ptr__;
  pmVar3 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
           ::operator[](this_00,local_e0);
  local_58[0x10] = pmVar3->is_null;
  local_e0[0] = (string)0x13;
  local_60 = this_00;
  pmVar3 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
           ::operator[](this_00,local_e0);
  local_109 = pmVar3->is_null;
  local_38 = context;
  Binder::CreateBinder
            ((Binder *)local_58,context,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
  pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)local_58);
  this = shared_ptr<duckdb::Binder,_true>::operator->((shared_ptr<duckdb::Binder,_true> *)local_58);
  index = Binder::GenerateTableIndex(this);
  local_e0._0_8_ = (ConstantExpression *)(local_e0 + 0x10);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"copy_csv","");
  BindContext::AddGenericBinding(&pBVar4->bind_context,index,(string *)local_e0,names,sql_types);
  if ((ConstantExpression *)local_e0._0_8_ != (ConstantExpression *)(local_e0 + 0x10)) {
    operator_delete((void *)local_e0._0_8_);
  }
  local_68 = 0;
  local_78.bigint = 0;
  local_78.hugeint.upper = 0;
  local_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((sql_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (sql_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      args_1 = vector<duckdb::LogicalType,_true>::operator[](sql_types,(size_type)local_f0._M_pi);
      args = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](names,(size_type)local_f0._M_pi);
      LVar1 = args_1->id_;
      if ((local_58[0x10] == '\0') && (LVar1 == DATE)) {
        local_108 = (undefined1  [8])0x0;
        peStack_100 = (element_type *)0x0;
        local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        make_uniq<duckdb::BoundReferenceExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,unsigned_long&>
                  ((duckdb *)&local_118,args,args_1,(unsigned_long *)&local_f0);
        pBVar5 = (BoundExpression *)operator_new(0x40);
        local_e0._0_8_ = local_118;
        local_118 = (ConstantExpression *)0x0;
        BoundExpression::BoundExpression
                  (pBVar5,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)local_e0);
        if ((ConstantExpression *)local_e0._0_8_ != (ConstantExpression *)0x0) {
          (**(code **)(*(long *)local_e0._0_8_ + 8))();
        }
        local_120._M_head_impl = (ParsedExpression *)pBVar5;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)local_108,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_120);
        if ((BoundExpression *)local_120._M_head_impl != (BoundExpression *)0x0) {
          (*((BaseExpression *)
            &((local_120._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
            _vptr_BaseExpression[1])();
        }
        local_120._M_head_impl = (ParsedExpression *)0x0;
        if (local_118 != (ConstantExpression *)0x0) {
          (*(local_118->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[1])();
        }
        local_118 = (ConstantExpression *)CONCAT71(local_118._1_7_,0xf);
        pmVar3 = ::std::
                 map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
                 ::operator[](local_60,(key_type *)&local_118);
        pCVar6 = (ConstantExpression *)operator_new(0x78);
        Value::Value((Value *)local_e0,pmVar3);
        ConstantExpression::ConstantExpression(pCVar6,(Value *)local_e0);
        Value::~Value((Value *)local_e0);
        local_120._M_head_impl = (ParsedExpression *)pCVar6;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)local_108,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_120);
        if ((ConstantExpression *)local_120._M_head_impl != (ConstantExpression *)0x0) {
          (*((BaseExpression *)
            &((local_120._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
            _vptr_BaseExpression[1])();
        }
        make_uniq_base<duckdb::ParsedExpression,duckdb::FunctionExpression,char_const(&)[9],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                  ((duckdb *)local_e0,(char (*) [9])0x1de3f93,
                   (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    *)local_108);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&local_78.hugeint,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_e0);
LAB_01199cbf:
        if ((ConstantExpression *)local_e0._0_8_ != (ConstantExpression *)0x0) {
          (**(code **)(*(long *)local_e0._0_8_ + 8))();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)local_108);
      }
      else {
        if ((LVar1 == TIMESTAMP || LVar1 == TIMESTAMP_TZ) && (local_109 == '\0')) {
          local_108 = (undefined1  [8])0x0;
          peStack_100 = (element_type *)0x0;
          local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          make_uniq<duckdb::BoundReferenceExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,unsigned_long&>
                    ((duckdb *)&local_118,args,args_1,(unsigned_long *)&local_f0);
          pBVar5 = (BoundExpression *)operator_new(0x40);
          local_e0._0_8_ = local_118;
          local_118 = (ConstantExpression *)0x0;
          BoundExpression::BoundExpression
                    (pBVar5,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)local_e0);
          if ((ConstantExpression *)local_e0._0_8_ != (ConstantExpression *)0x0) {
            (**(code **)(*(long *)local_e0._0_8_ + 8))();
          }
          local_120._M_head_impl = (ParsedExpression *)pBVar5;
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)local_108,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_120);
          if ((BoundExpression *)local_120._M_head_impl != (BoundExpression *)0x0) {
            (*((BaseExpression *)
              &((local_120._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
              _vptr_BaseExpression[1])();
          }
          local_120._M_head_impl = (ParsedExpression *)0x0;
          if (local_118 != (ConstantExpression *)0x0) {
            (*(local_118->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[1])();
          }
          local_118 = (ConstantExpression *)CONCAT71(local_118._1_7_,0x13);
          pmVar3 = ::std::
                   map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
                   ::operator[](local_60,(key_type *)&local_118);
          pCVar6 = (ConstantExpression *)operator_new(0x78);
          Value::Value((Value *)local_e0,pmVar3);
          ConstantExpression::ConstantExpression(pCVar6,(Value *)local_e0);
          Value::~Value((Value *)local_e0);
          local_120._M_head_impl = (ParsedExpression *)pCVar6;
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)local_108,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_120);
          if ((ConstantExpression *)local_120._M_head_impl != (ConstantExpression *)0x0) {
            (*((BaseExpression *)
              &((local_120._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
              _vptr_BaseExpression[1])();
          }
          make_uniq_base<duckdb::ParsedExpression,duckdb::FunctionExpression,char_const(&)[9],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                    ((duckdb *)local_e0,(char (*) [9])0x1de3f93,
                     (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                      *)local_108);
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&local_78.hugeint,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)local_e0);
          goto LAB_01199cbf;
        }
        make_uniq<duckdb::BoundReferenceExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,unsigned_long&>
                  ((duckdb *)&local_120,args,args_1,(unsigned_long *)&local_f0);
        pBVar5 = (BoundExpression *)operator_new(0x40);
        local_e0._0_8_ = local_120._M_head_impl;
        local_120._M_head_impl = (ParsedExpression *)0x0;
        BoundExpression::BoundExpression
                  (pBVar5,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)local_e0);
        local_108 = (undefined1  [8])pBVar5;
        if ((ConstantExpression *)local_e0._0_8_ != (ConstantExpression *)0x0) {
          (**(code **)(*(long *)local_e0._0_8_ + 8))();
        }
        if ((ConstantExpression *)local_120._M_head_impl != (ConstantExpression *)0x0) {
          (*((BaseExpression *)
            &((local_120._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
            _vptr_BaseExpression[1])();
        }
        make_uniq_base<duckdb::ParsedExpression,duckdb::CastExpression,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::BoundExpression,std::default_delete<duckdb::BoundExpression>,true>>
                  ((duckdb *)local_e0,&LogicalType::VARCHAR,
                   (unique_ptr<duckdb::BoundExpression,_std::default_delete<duckdb::BoundExpression>,_true>
                    *)local_108);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&local_78.hugeint,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_e0);
        if ((ConstantExpression *)local_e0._0_8_ != (ConstantExpression *)0x0) {
          (**(code **)(*(long *)local_e0._0_8_ + 8))();
        }
        if (local_108 != (undefined1  [8])0x0) {
          (*(((ParsedExpression *)local_108)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
      }
      local_f0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(local_f0._M_pi)->_vptr__Sp_counted_base + 1);
    } while (local_f0._M_pi <
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (((long)(sql_types->
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(sql_types->
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
  }
  (((_Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
     *)&((local_e8.ptr)->super_Binding)._vptr_Binding)->_M_impl).super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)&((local_e8.ptr)->super_Binding).binding_type = (pointer)0x0;
  ((local_e8.ptr)->super_Binding).alias.catalog._M_dataplus._M_p = (pointer)0x0;
  binder_00 = shared_ptr<duckdb::Binder,_true>::operator*
                        ((shared_ptr<duckdb::Binder,_true> *)local_58);
  ExpressionBinder::ExpressionBinder((ExpressionBinder *)local_e0,binder_00,local_38,false);
  LogicalType::LogicalType((LogicalType *)local_108,VARCHAR);
  local_e0._24_8_ = local_f8._M_pi;
  local_e0._16_8_ = peStack_100;
  local_e0._8_2_ = local_108._0_2_;
  LogicalType::~LogicalType((LogicalType *)local_108);
  uVar2 = local_78.hugeint.upper;
  if (local_78.bigint != local_78.hugeint.upper) {
    result_type = local_78.bigint;
    do {
      ExpressionBinder::Bind
                ((ExpressionBinder *)local_108,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_e0,(optional_ptr<duckdb::LogicalType,_true>)result_type,false);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)local_e8.ptr,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_108);
      if (local_108 != (undefined1  [8])0x0) {
        (*(((ParsedExpression *)local_108)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      result_type = result_type + 8;
    } while (result_type != uVar2);
  }
  ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_e0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)&local_78.hugeint);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  return (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *)local_e8.ptr;
}

Assistant:

static vector<unique_ptr<Expression>> CreateCastExpressions(WriteCSVData &bind_data, ClientContext &context,
                                                            const vector<string> &names,
                                                            const vector<LogicalType> &sql_types) {
	auto &options = bind_data.options;
	auto &formats = options.write_date_format;

	bool has_dateformat = !formats[LogicalTypeId::DATE].IsNull();
	bool has_timestampformat = !formats[LogicalTypeId::TIMESTAMP].IsNull();

	// Create a binder
	auto binder = Binder::CreateBinder(context);

	auto &bind_context = binder->bind_context;
	auto table_index = binder->GenerateTableIndex();
	bind_context.AddGenericBinding(table_index, "copy_csv", names, sql_types);

	// Create the ParsedExpressions (cast, strftime, etc..)
	vector<unique_ptr<ParsedExpression>> unbound_expressions;
	for (idx_t i = 0; i < sql_types.size(); i++) {
		auto &type = sql_types[i];
		auto &name = names[i];

		bool is_timestamp = type.id() == LogicalTypeId::TIMESTAMP || type.id() == LogicalTypeId::TIMESTAMP_TZ;
		if (has_dateformat && type.id() == LogicalTypeId::DATE) {
			// strftime(<name>, 'format')
			vector<unique_ptr<ParsedExpression>> children;
			children.push_back(make_uniq<BoundExpression>(make_uniq<BoundReferenceExpression>(name, type, i)));
			children.push_back(make_uniq<ConstantExpression>(formats[LogicalTypeId::DATE]));
			auto func = make_uniq_base<ParsedExpression, FunctionExpression>("strftime", std::move(children));
			unbound_expressions.push_back(std::move(func));
		} else if (has_timestampformat && is_timestamp) {
			// strftime(<name>, 'format')
			vector<unique_ptr<ParsedExpression>> children;
			children.push_back(make_uniq<BoundExpression>(make_uniq<BoundReferenceExpression>(name, type, i)));
			children.push_back(make_uniq<ConstantExpression>(formats[LogicalTypeId::TIMESTAMP]));
			auto func = make_uniq_base<ParsedExpression, FunctionExpression>("strftime", std::move(children));
			unbound_expressions.push_back(std::move(func));
		} else {
			// CAST <name> AS VARCHAR
			auto column = make_uniq<BoundExpression>(make_uniq<BoundReferenceExpression>(name, type, i));
			auto expr = make_uniq_base<ParsedExpression, CastExpression>(LogicalType::VARCHAR, std::move(column));
			unbound_expressions.push_back(std::move(expr));
		}
	}

	// Create an ExpressionBinder, bind the Expressions
	vector<unique_ptr<Expression>> expressions;
	ExpressionBinder expression_binder(*binder, context);
	expression_binder.target_type = LogicalType::VARCHAR;
	for (auto &expr : unbound_expressions) {
		expressions.push_back(expression_binder.Bind(expr));
	}

	return expressions;
}